

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

void setMonitoredItemSettings
               (UA_Server *server,UA_MonitoredItem *mon,UA_MonitoringMode monitoringMode,
               UA_MonitoringParameters *params)

{
  UA_Double *pUVar1;
  UA_Node *pUVar2;
  UA_DataChangeFilter *filter;
  UA_VariableNode *vn;
  UA_Double samplingInterval;
  UA_MonitoringParameters *params_local;
  UA_MonitoringMode monitoringMode_local;
  UA_MonitoredItem *mon_local;
  UA_Server *server_local;
  
  MonitoredItem_unregisterSampleJob(server,mon);
  mon->monitoringMode = monitoringMode;
  mon->clientHandle = params->clientHandle;
  vn = (UA_VariableNode *)params->samplingInterval;
  if (mon->attributeID == 0xd) {
    pUVar2 = UA_NodeStore_get(server->nodestore,&mon->monitoredNodeId);
    if (((pUVar2 != (UA_Node *)0x0) && (pUVar2->nodeClass == UA_NODECLASS_VARIABLE)) &&
       ((double)vn < (double)pUVar2[2].browseName.name.length)) {
      vn = (UA_VariableNode *)pUVar2[2].browseName.name.length;
    }
  }
  else if (mon->attributeID == 0xc) {
    vn = (UA_VariableNode *)0x40c3880000000000;
  }
  mon->samplingInterval = (UA_Double)vn;
  pUVar1 = &(server->config).samplingIntervalLimits.max;
  if ((double)vn < *pUVar1 || (double)vn == *pUVar1) {
    if ((server->config).samplingIntervalLimits.min <= (double)vn) {
      mon->samplingInterval = (UA_Double)vn;
    }
    else {
      mon->samplingInterval = (server->config).samplingIntervalLimits.min;
    }
  }
  else {
    mon->samplingInterval = (server->config).samplingIntervalLimits.max;
  }
  if (NAN((double)vn)) {
    mon->samplingInterval = (server->config).samplingIntervalLimits.min;
  }
  if (((params->filter).encoding == UA_EXTENSIONOBJECT_DECODED) &&
     ((params->filter).content.decoded.type == (UA_DataType *)0x161dc0)) {
    mon->trigger = *(params->filter).content.decoded.data;
  }
  else {
    mon->trigger = UA_DATACHANGETRIGGER_STATUSVALUE;
  }
  if ((server->config).queueSizeLimits.max < params->queueSize) {
    mon->maxQueueSize = (server->config).queueSizeLimits.max;
  }
  else if (params->queueSize < (server->config).queueSizeLimits.min) {
    mon->maxQueueSize = (server->config).queueSizeLimits.min;
  }
  else {
    mon->maxQueueSize = params->queueSize;
  }
  mon->discardOldest = (UA_Boolean)(params->discardOldest & 1);
  if (monitoringMode == UA_MONITORINGMODE_REPORTING) {
    MonitoredItem_registerSampleJob(server,mon);
  }
  return;
}

Assistant:

static void
setMonitoredItemSettings(UA_Server *server, UA_MonitoredItem *mon,
                         UA_MonitoringMode monitoringMode,
                         const UA_MonitoringParameters *params) {
    MonitoredItem_unregisterSampleJob(server, mon);
    mon->monitoringMode = monitoringMode;

    /* ClientHandle */
    mon->clientHandle = params->clientHandle;

    /* SamplingInterval */
    UA_Double samplingInterval = params->samplingInterval;
    if(mon->attributeID == UA_ATTRIBUTEID_VALUE) {
        const UA_VariableNode *vn = (const UA_VariableNode*)
            UA_NodeStore_get(server->nodestore, &mon->monitoredNodeId);
        if(vn && vn->nodeClass == UA_NODECLASS_VARIABLE &&
           samplingInterval <  vn->minimumSamplingInterval)
            samplingInterval = vn->minimumSamplingInterval;
    } else if(mon->attributeID == UA_ATTRIBUTEID_EVENTNOTIFIER) {
        /* TODO: events should not need a samplinginterval */
        samplingInterval = 10000.0f; // 10 seconds to reduce the load
    }
    mon->samplingInterval = samplingInterval;
    UA_BOUNDEDVALUE_SETWBOUNDS(server->config.samplingIntervalLimits,
        samplingInterval, mon->samplingInterval);
    if(samplingInterval != samplingInterval) /* Check for nan */
        mon->samplingInterval = server->config.samplingIntervalLimits.min;

    /* Filter */
    if(params->filter.encoding != UA_EXTENSIONOBJECT_DECODED ||
       params->filter.content.decoded.type != &UA_TYPES[UA_TYPES_DATACHANGEFILTER]) {
        /* Default: Trigger only on the value and the statuscode */
        mon->trigger = UA_DATACHANGETRIGGER_STATUSVALUE;
    } else {
        UA_DataChangeFilter *filter = params->filter.content.decoded.data;
        mon->trigger = filter->trigger;
    }

    /* QueueSize */
    UA_BOUNDEDVALUE_SETWBOUNDS(server->config.queueSizeLimits,
                               params->queueSize, mon->maxQueueSize);

    /* DiscardOldest */
    mon->discardOldest = params->discardOldest;

    /* Register sample job if reporting is enabled */
    if(monitoringMode == UA_MONITORINGMODE_REPORTING)
        MonitoredItem_registerSampleJob(server, mon);
}